

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<Replace>::relocate
          (QArrayDataPointer<Replace> *this,qsizetype offset,Replace **data)

{
  bool bVar1;
  Replace *in_RDX;
  long in_RSI;
  Replace *in_RDI;
  Replace **unaff_retaddr;
  Replace *res;
  char16_t *n;
  Replace *c;
  
  n = (in_RDI->in).d.ptr + in_RSI * 0x18;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<Replace,long_long>(in_RDX,(longlong)n,in_RDI);
  if ((in_RDX != (Replace *)0x0) &&
     (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<Replace>,Replace_const*>
                        (unaff_retaddr,(QArrayDataPointer<Replace> *)c), bVar1)) {
    (in_RDX->in).d.d = (in_RDX->in).d.d + in_RSI * 3;
  }
  (in_RDI->in).d.ptr = n;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }